

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

void __thiscall
TwoStageDynamicBayesianNetwork::ScopeBackup
          (TwoStageDynamicBayesianNetwork *this,Scope *stateScope,Scope *agentScope,Scope *X,
          Scope *A)

{
  bool bVar1;
  reference puVar2;
  Scope *s;
  const_reference this_00;
  const_reference this_01;
  Scope *in_RCX;
  long in_RDI;
  Scope *in_R8;
  Scope *unaff_retaddr;
  Scope *in_stack_00000008;
  TwoStageDynamicBayesianNetwork *in_stack_00000010;
  iterator o_it;
  Index yI;
  iterator y_it;
  Scope O;
  Scope Y;
  Scope *in_stack_ffffffffffffff08;
  Scope *in_stack_ffffffffffffff10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff18;
  Scope *in_stack_ffffffffffffff20;
  Scope *in_stack_ffffffffffffff28;
  Scope *in_stack_ffffffffffffff30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  uint *local_88;
  uint local_7c;
  uint *local_78;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70 [9];
  Scope *local_28;
  Scope *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  Scope::Scope(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  Scope::Scope(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ComputeWithinNextStageClosure(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xaf2161);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xaf216e);
  local_70[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&in_stack_ffffffffffffff08->super_SDT);
  while( true ) {
    local_78 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (&in_stack_ffffffffffffff08->super_SDT);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(local_70);
    local_7c = *puVar2;
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    Scope::Insert(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    Scope::Insert(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_88 = (uint *)__gnu_cxx::
                       __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       ::operator++(in_stack_ffffffffffffff18,
                                    (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  }
  local_90._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&in_stack_ffffffffffffff08->super_SDT);
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              (&in_stack_ffffffffffffff08->super_SDT);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    s = (Scope *)(in_RDI + 0x68);
    in_stack_ffffffffffffff20 = local_20;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator*(&local_90);
    this_00 = std::vector<Scope,_std::allocator<Scope>_>::at
                        ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff10,
                         (size_type)in_stack_ffffffffffffff08);
    Scope::Insert(this_00,s);
    in_stack_ffffffffffffff10 = (Scope *)(in_RDI + 0x80);
    in_stack_ffffffffffffff08 = local_28;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator*(&local_90);
    this_01 = std::vector<Scope,_std::allocator<Scope>_>::at
                        ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff10,
                         (size_type)in_stack_ffffffffffffff08);
    Scope::Insert(this_00,s);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)this_01,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  }
  Scope::Sort(in_stack_ffffffffffffff20);
  Scope::Sort(in_stack_ffffffffffffff20);
  Scope::~Scope((Scope *)0xaf23a8);
  Scope::~Scope((Scope *)0xaf23b5);
  return;
}

Assistant:

void TwoStageDynamicBayesianNetwork::
ScopeBackup(    const Scope & stateScope, 
                const Scope & agentScope,
                Scope & X,
                Scope & A) const
{
    //first we compute the 'closure' of the NS state factors Y and
    //observations O. I.e., within stage connections can grow the set
    //of Y and O that need to be considered:
    Scope Y = stateScope;
    Scope O = agentScope;
    ComputeWithinNextStageClosure(Y,O);    

    X.clear();
    A.clear();
    //Next we do the backup of the Ys and Os
    for( Scope::iterator y_it = Y.begin(); y_it != Y.end(); y_it++)
    {
        Index yI = *y_it;
        X.Insert( _m_XSoI_Y.at(yI) );
        A.Insert( _m_ASoI_Y.at(yI) );
    }
    for( Scope::iterator o_it = O.begin(); o_it != O.end(); o_it++)
    {
        X.Insert( _m_XSoI_O.at(*o_it) );
        A.Insert( _m_ASoI_O.at(*o_it) );
    }
    X.Sort();
    A.Sort();
    return;
}